

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O0

void TestSquare(void)

{
  char buffer [1024];
  Bignum bignum;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  char *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  undefined2 in_stack_fffffffffffffa0c;
  uint16_t in_stack_fffffffffffffa0e;
  Bignum *in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa1c;
  Bignum *in_stack_fffffffffffffa20;
  int in_stack_fffffffffffffa2c;
  char *in_stack_fffffffffffffa30;
  Bignum *in_stack_fffffffffffffa38;
  Bignum *in_stack_fffffffffffffa50;
  Bignum local_204;
  
  double_conversion::Bignum::Bignum(&local_204);
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0e);
  double_conversion::Bignum::Square(in_stack_fffffffffffffa50);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper((char *)in_stack_fffffffffffffa10,
              CONCAT22(in_stack_fffffffffffffa0e,in_stack_fffffffffffffa0c),
              in_stack_fffffffffffffa00,(bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                    (char *)in_stack_fffffffffffffa10,
                    (char *)CONCAT26(in_stack_fffffffffffffa0e,
                                     CONCAT24(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08)),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0e);
  double_conversion::Bignum::Square(in_stack_fffffffffffffa50);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper((char *)in_stack_fffffffffffffa10,
              CONCAT22(in_stack_fffffffffffffa0e,in_stack_fffffffffffffa0c),
              in_stack_fffffffffffffa00,(bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                    (char *)in_stack_fffffffffffffa10,
                    (char *)CONCAT26(in_stack_fffffffffffffa0e,
                                     CONCAT24(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08)),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignUInt16(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0e);
  double_conversion::Bignum::Square(in_stack_fffffffffffffa50);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper((char *)in_stack_fffffffffffffa10,
              CONCAT22(in_stack_fffffffffffffa0e,in_stack_fffffffffffffa0c),
              in_stack_fffffffffffffa00,(bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                    (char *)in_stack_fffffffffffffa10,
                    (char *)CONCAT26(in_stack_fffffffffffffa0e,
                                     CONCAT24(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08)),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  AssignHexString(in_stack_fffffffffffffa20,
                  (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
  double_conversion::Bignum::Square(in_stack_fffffffffffffa50);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper((char *)in_stack_fffffffffffffa10,
              CONCAT22(in_stack_fffffffffffffa0e,in_stack_fffffffffffffa0c),
              in_stack_fffffffffffffa00,(bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                    (char *)in_stack_fffffffffffffa10,
                    (char *)CONCAT26(in_stack_fffffffffffffa0e,
                                     CONCAT24(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08)),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  AssignHexString(in_stack_fffffffffffffa20,
                  (char *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18));
  double_conversion::Bignum::Square(in_stack_fffffffffffffa50);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper((char *)in_stack_fffffffffffffa10,
              CONCAT22(in_stack_fffffffffffffa0e,in_stack_fffffffffffffa0c),
              in_stack_fffffffffffffa00,(bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper((char *)in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
                    (char *)in_stack_fffffffffffffa10,
                    (char *)CONCAT26(in_stack_fffffffffffffa0e,
                                     CONCAT24(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08)),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  return;
}

Assistant:

TEST(Square) {
  Bignum bignum;
  char buffer[kBufferSize];

  bignum.AssignUInt16(1);
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignUInt16(2);
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("4", buffer);

  bignum.AssignUInt16(10);
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("64", buffer);

  AssignHexString(&bignum, "FFFFFFF");
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFE0000001", buffer);

  AssignHexString(&bignum, "FFFFFFFFFFFFFF");
  bignum.Square();
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FFFFFFFFFFFFFE00000000000001", buffer);
}